

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascOpenFile.cpp
# Opt level: O2

bool CascOpenFileByCKey(HANDLE hStorage,PQUERY_KEY pCKey,DWORD dwOpenFlags,HANDLE *phFile)

{
  DWORD dwErrCode;
  bool bVar1;
  TCascStorage *hs;
  
  hs = IsValidCascStorageHandle(hStorage);
  if (hs == (TCascStorage *)0x0) {
    dwErrCode = 9;
  }
  else {
    if ((((pCKey != (PQUERY_KEY)0x0) && (pCKey->pbData != (LPBYTE)0x0)) && (phFile != (HANDLE *)0x0)
        ) && (pCKey->cbData != 0)) {
      bVar1 = OpenFileByCKey(hs,pCKey,dwOpenFlags,(TCascFile **)phFile);
      return bVar1;
    }
    dwErrCode = 0x16;
  }
  SetLastError(dwErrCode);
  return false;
}

Assistant:

bool WINAPI CascOpenFileByCKey(HANDLE hStorage, PQUERY_KEY pCKey, DWORD dwOpenFlags, HANDLE * phFile)
{
    TCascStorage * hs;

    // Validate the storage handle
    hs = IsValidCascStorageHandle(hStorage);
    if(hs == NULL)
    {
        SetLastError(ERROR_INVALID_HANDLE);
        return false;
    }

    // Validate the other parameters
    if(pCKey == NULL || pCKey->pbData == NULL || pCKey->cbData == 0 || phFile == NULL)
    {
        SetLastError(ERROR_INVALID_PARAMETER);
        return false;
    }

    // Use the internal function fo open the file
    return OpenFileByCKey(hs, pCKey, dwOpenFlags, (TCascFile **)phFile);
}